

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagewindow.cc
# Opt level: O2

void __thiscall bgui::ImageWindow::onKey(ImageWindow *this,char c,SpecialKey key,int x,int y)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _func_int **pp_Var7;
  byte bVar8;
  undefined7 in_register_00000031;
  undefined8 uVar9;
  ImageAdapterBase *pIVar10;
  uint uVar11;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined8 uStack_1d0;
  int h;
  undefined4 uStack_1bc;
  ostringstream out;
  
  iVar3 = (int)CONCAT71(in_register_00000031,c);
  this->lastkey = c;
  if (iVar3 == 0x68) {
    bVar1 = BaseWindow::hasInfoText(&this->super_BaseWindow);
    if (bVar1) goto LAB_0012b58a;
    pcVar6 = (this->helptext)._M_dataplus._M_p;
LAB_0012b604:
    BaseWindow::setInfoText(&this->super_BaseWindow,pcVar6);
    goto switchD_0012b5c2_caseD_63;
  }
  if (iVar3 == 0x76) {
    bVar1 = BaseWindow::hasInfoText(&this->super_BaseWindow);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
      poVar5 = std::operator<<((ostream *)&out,"This program is based on cvkit version ");
      poVar5 = std::operator<<(poVar5,"2.6.17");
      std::operator<<(poVar5,"\n");
      std::operator<<((ostream *)&out,"Copyright (C) 2016 - 2023 Roboception GmbH\n");
      std::operator<<((ostream *)&out,
                      "Copyright (C) 2014, 2015 Institute of Robotics and Mechatronics, German Aerospace Center\n"
                     );
      std::operator<<((ostream *)&out,"Author: Heiko Hirschmueller\n");
      std::operator<<((ostream *)&out,"Contact: heiko.hirschmueller@roboception.de\n");
      std::operator<<((ostream *)&out,"\n");
      std::operator<<((ostream *)&out,
                      "This program is based in part on the work of the Independent JPEG Group.\n");
      pcVar6 = (char *)png_get_copyright(0);
      poVar5 = std::operator<<((ostream *)&out,pcVar6);
      std::operator<<(poVar5,"\n");
      std::__cxx11::stringbuf::str();
      BaseWindow::setInfoText(&this->super_BaseWindow,(char *)CONCAT44(uStack_1bc,h));
      std::__cxx11::string::~string((string *)&h);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
      goto switchD_0012b5c2_caseD_63;
    }
LAB_0012b58a:
    pcVar6 = "";
    goto LAB_0012b604;
  }
  BaseWindow::setInfoText(&this->super_BaseWindow,"");
  iVar2 = (int)c;
  switch(iVar2) {
  case 0x61:
    if (this->adapt == (ImageAdapterBase *)0x0) goto switchD_0012b5c2_caseD_63;
    BaseWindow::getSize(&this->super_BaseWindow,(int *)&out,&h);
    (*this->adapt->_vptr_ImageAdapterBase[4])
              (this->adapt,(long)this->imx,(long)this->imy,(long)_out,(long)h);
    break;
  case 0x62:
    if (this->adapt == (ImageAdapterBase *)0x0) goto switchD_0012b5c2_caseD_63;
    BaseWindow::getSize(&this->super_BaseWindow,(int *)&out,&h);
    uVar11 = this->imx + x;
    if ((int)uVar11 < 0) goto switchD_0012b5c2_caseD_63;
    iVar3 = (*this->adapt->_vptr_ImageAdapterBase[0xb])();
    if (((x < 0) || (CONCAT44(extraout_var_01,iVar3) <= (long)(ulong)uVar11)) ||
       ((_out <= x || (uVar11 = this->imy + y, (int)uVar11 < 0)))) goto switchD_0012b5c2_caseD_63;
    iVar3 = (*this->adapt->_vptr_ImageAdapterBase[0xc])();
    if ((((y < 0) || (CONCAT44(extraout_var_02,iVar3) <= (long)(ulong)uVar11)) || (h <= y)) ||
       ((*this->adapt->_vptr_ImageAdapterBase[9])
                  (this->adapt,(long)x + (long)this->imx,(long)y + (long)this->imy),
       0x7fefffffffffffff < (ulong)ABS(extraout_XMM0_Qa_00))) goto switchD_0012b5c2_caseD_63;
    this->adapt->imin = extraout_XMM0_Qa_00;
    break;
  case 99:
  case 100:
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x75:
  case 0x76:
    goto switchD_0012b5c2_caseD_63;
  case 0x66:
    if (this->adapt == (ImageAdapterBase *)0x0) goto switchD_0012b5c2_caseD_63;
    BaseWindow::getSize(&this->super_BaseWindow,(int *)&out,&h);
    iVar3 = (*this->adapt->_vptr_ImageAdapterBase[0xb])();
    this->imx = iVar3 - (_out + this->imx);
    pIVar10 = this->adapt;
    iVar3 = pIVar10->rotation;
    bVar8 = pIVar10->flip ^ 1;
    goto LAB_0012bb37;
  case 0x69:
    this->showinfo = (bool)(this->showinfo ^ 1);
    goto LAB_0012bb47;
  case 0x6c:
    if (this->adapt == (ImageAdapterBase *)0x0) goto switchD_0012b5c2_caseD_63;
    iVar3 = this->imx;
    iVar2 = this->imy;
    BaseWindow::getSize(&this->super_BaseWindow,(int *)&out,&h);
    pIVar10 = this->adapt;
    if (pIVar10->flip != false) {
      iVar4 = (*pIVar10->_vptr_ImageAdapterBase[0xb])();
      iVar3 = iVar4 - (iVar3 + _out);
      pIVar10 = this->adapt;
    }
    uVar11 = h / 2 + iVar2;
    this->imx = _out / -2 + uVar11;
    iVar2 = (*pIVar10->_vptr_ImageAdapterBase[0xb])
                      (pIVar10,(ulong)uVar11,(long)_out % -2 & 0xffffffff);
    uVar11 = ~(_out / 2 + iVar3);
    this->imy = iVar2 + h / -2 + uVar11;
    pIVar10 = this->adapt;
    if (pIVar10->flip == true) {
      iVar3 = (*pIVar10->_vptr_ImageAdapterBase[0xc])
                        (pIVar10,(ulong)uVar11,(long)h % -2 & 0xffffffff);
      this->imx = iVar3 - (_out + this->imx);
      pIVar10 = this->adapt;
      bVar8 = pIVar10->flip;
    }
    else {
      bVar8 = 0;
    }
    iVar3 = pIVar10->rotation + -1;
    goto LAB_0012bb31;
  case 0x6d:
    pIVar10 = this->adapt;
    if (pIVar10 == (ImageAdapterBase *)0x0) goto switchD_0012b5c2_caseD_63;
    if ((ulong)pIVar10->map < 3) {
      pIVar10->map = *(mapping *)(&DAT_0014eb30 + (ulong)pIVar10->map * 4);
    }
LAB_0012baa1:
    redrawImage(this,true);
    goto switchD_0012b5c2_caseD_63;
  case 0x71:
    BaseWindow::sendClose(&this->super_BaseWindow);
    goto switchD_0012b5c2_caseD_63;
  case 0x72:
    if (this->adapt == (ImageAdapterBase *)0x0) goto switchD_0012b5c2_caseD_63;
    iVar3 = this->imx;
    iVar2 = this->imy;
    BaseWindow::getSize(&this->super_BaseWindow,(int *)&out,&h);
    pIVar10 = this->adapt;
    if (pIVar10->flip == true) {
      iVar4 = (*pIVar10->_vptr_ImageAdapterBase[0xb])();
      iVar3 = iVar4 - (iVar3 + _out);
      pIVar10 = this->adapt;
    }
    iVar4 = (*pIVar10->_vptr_ImageAdapterBase[0xc])();
    this->imx = iVar4 + _out / -2 + ~(h / 2 + iVar2);
    this->imy = h / -2 + iVar3 + _out / 2;
    pIVar10 = this->adapt;
    if (pIVar10->flip == true) {
      iVar3 = (*pIVar10->_vptr_ImageAdapterBase[0xc])
                        (pIVar10,(ulong)(uint)h,(long)h % -2 & 0xffffffff);
      this->imx = iVar3 - (_out + this->imx);
      pIVar10 = this->adapt;
      bVar8 = pIVar10->flip;
    }
    else {
      bVar8 = 0;
    }
    iVar3 = pIVar10->rotation + 1;
LAB_0012bb31:
    bVar8 = bVar8 & 1;
LAB_0012bb37:
    ImageAdapterBase::setRotationFlip(pIVar10,iVar3,(bool)bVar8);
    break;
  case 0x73:
    if (this->adapt != (ImageAdapterBase *)0x0) {
      iVar3 = (*this->adapt->_vptr_ImageAdapterBase[0xb])();
      iVar2 = (*this->adapt->_vptr_ImageAdapterBase[0xc])();
      BaseWindow::setSize(&this->super_BaseWindow,iVar3,iVar2);
    }
    goto switchD_0012b5c2_caseD_63;
  case 0x74:
    pIVar10 = this->adapt;
    if (pIVar10 == (ImageAdapterBase *)0x0) goto switchD_0012b5c2_caseD_63;
    iVar3 = (*pIVar10->_vptr_ImageAdapterBase[3])(pIVar10);
    (*pIVar10->_vptr_ImageAdapterBase[2])(pIVar10,(ulong)(byte)((byte)iVar3 ^ 1));
    break;
  case 0x77:
    if (this->adapt == (ImageAdapterBase *)0x0) goto switchD_0012b5c2_caseD_63;
    BaseWindow::getSize(&this->super_BaseWindow,(int *)&out,&h);
    uVar11 = this->imx + x;
    if ((int)uVar11 < 0) goto switchD_0012b5c2_caseD_63;
    iVar3 = (*this->adapt->_vptr_ImageAdapterBase[0xb])();
    if ((((x < 0) || (CONCAT44(extraout_var,iVar3) <= (long)(ulong)uVar11)) || (_out <= x)) ||
       (uVar11 = this->imy + y, (int)uVar11 < 0)) goto switchD_0012b5c2_caseD_63;
    iVar3 = (*this->adapt->_vptr_ImageAdapterBase[0xc])();
    if (((y < 0) || (CONCAT44(extraout_var_00,iVar3) <= (long)(ulong)uVar11)) ||
       ((h <= y ||
        ((*this->adapt->_vptr_ImageAdapterBase[9])
                   (this->adapt,(long)x + (long)this->imx,(long)y + (long)this->imy),
        0x7fefffffffffffff < (ulong)ABS(extraout_XMM0_Qa))))) goto switchD_0012b5c2_caseD_63;
    this->adapt->imax = extraout_XMM0_Qa;
    break;
  default:
    switch(iVar2) {
    case 0x2b:
      pp_Var7 = (this->super_BaseWindow)._vptr_BaseWindow;
      uVar9 = 3;
      uStack_1d0 = 8;
      goto LAB_0012ba5d;
    case 0x2c:
    case 0x2e:
    case 0x2f:
    case 0x33:
      goto switchD_0012b5c2_caseD_63;
    case 0x2d:
      pp_Var7 = (this->super_BaseWindow)._vptr_BaseWindow;
      uVar9 = 4;
      uStack_1d0 = 0x10;
LAB_0012ba5d:
      (*pp_Var7[3])(this,uVar9,(ulong)(uint)x,(ulong)(uint)y,uStack_1d0);
      goto switchD_0012b5c2_caseD_63;
    case 0x30:
      if (this->adapt == (ImageAdapterBase *)0x0) goto switchD_0012b5c2_caseD_63;
      this->adapt->scale = 1.0;
      break;
    case 0x31:
    case 0x32:
    case 0x34:
      if (this->adapt == (ImageAdapterBase *)0x0) goto switchD_0012b5c2_caseD_63;
      this->adapt->gamma = (double)(iVar3 + -0x30);
      break;
    default:
      if (iVar2 == 0x42) {
        if (this->adapt != (ImageAdapterBase *)0x0) {
          this->adapt->channel = 2;
        }
      }
      else if (iVar2 == 0x43) {
        if (this->adapt != (ImageAdapterBase *)0x0) {
          this->adapt->channel = -1;
        }
      }
      else if (iVar2 == 0x47) {
        if (this->adapt != (ImageAdapterBase *)0x0) {
          this->adapt->channel = 1;
        }
      }
      else {
        if (iVar2 != 0x52) goto switchD_0012b5c2_caseD_63;
        if (this->adapt != (ImageAdapterBase *)0x0) {
          this->adapt->channel = 0;
        }
      }
      goto LAB_0012baa1;
    }
  }
  redrawImage(this,true);
LAB_0012bb47:
  updateInfo(this);
switchD_0012b5c2_caseD_63:
  if (key == k_esc) {
    BaseWindow::sendClose(&this->super_BaseWindow);
  }
  return;
}

Assistant:

void ImageWindow::onKey(char c, SpecialKey key, int x, int y)
{
  lastkey=c;

  if (c != 'h' && c != 'v')
  {
    setInfoText("");
  }

  switch (c)
  {
    case '0':
      if (adapt != 0)
      {
        adapt->setScale(1);
        redrawImage();
        updateInfo();
      }

      break;

    case '1':
    case '2':
    case '4':
      if (adapt != 0)
      {
        adapt->setGamma(c-'1'+1);
        redrawImage();
        updateInfo();
      }

      break;

    case 'R':
      if (adapt != 0)
      {
        adapt->setChannel(0);
      }

      redrawImage();
      break;

    case 'G':
      if (adapt != 0)
      {
        adapt->setChannel(1);
      }

      redrawImage();
      break;

    case 'B':
      if (adapt != 0)
      {
        adapt->setChannel(2);
      }

      redrawImage();
      break;

    case 'C':
      if (adapt != 0)
      {
        adapt->setChannel(-1);
      }

      redrawImage();
      break;

    case '+':
      onMousePressed(button4, x, y, button4mask);
      break;

    case '-':
      onMousePressed(button5, x, y, button5mask);
      break;

    case 't':
      if (adapt != 0)
      {
        adapt->setSmoothing(!adapt->getSmoothing());
        redrawImage();
        updateInfo();
      }

      break;

    case 'a':
      if (adapt != 0)
      {
        int w, h;

        getSize(w, h);

        adapt->adaptMinMaxIntensity(imx, imy, w, h);
        redrawImage();
        updateInfo();
      }

      break;

    case 'b':
      if (adapt != 0)
      {
        int w, h;

        getSize(w, h);

        if (x+imx >= 0 && x+imx < adapt->getWidth() && x >= 0 && x < w
            && y+imy >= 0 && y+imy < adapt->getHeight() && y >= 0 && y < h)
        {
          double v=adapt->getIntensityOfPixel(x+imx, y+imy);

          if (std::isfinite(v))
          {
            adapt->setMinIntensity(v);
            redrawImage();
            updateInfo();
          }
        }
      }

      break;

    case 'w':
      if (adapt != 0)
      {
        int w, h;

        getSize(w, h);

        if (x+imx >= 0 && x+imx < adapt->getWidth() && x >= 0 && x < w
            && y+imy >= 0 && y+imy < adapt->getHeight() && y >= 0 && y < h)
        {
          double v=adapt->getIntensityOfPixel(x+imx, y+imy);

          if (std::isfinite(v))
          {
            adapt->setMaxIntensity(v);
            redrawImage();
            updateInfo();
          }
        }
      }

      break;

    case 'm':
      if (adapt != 0)
      {
        switch (adapt->getMapping())
        {
          case map_raw:
            adapt->setMapping(map_jet);
            break;

          case map_jet:
            adapt->setMapping(map_rainbow);
            break;

          case map_rainbow:
            adapt->setMapping(map_raw);
            break;
        }

        redrawImage();
      }

      break;

    case 'i':
      showinfo=!showinfo;
      updateInfo();
      break;

    case 'h':
      if (!hasInfoText())
      {
        setInfoText(helptext.c_str());
      }
      else
      {
        setInfoText("");
      }

      break;

    case 'v':
      if (!hasInfoText())
      {
        std::ostringstream out;

        out << "This program is based on cvkit version " << VERSION << "\n";
        out << "Copyright (C) 2016 - 2023 Roboception GmbH\n";
        out << "Copyright (C) 2014, 2015 Institute of Robotics and Mechatronics, German Aerospace Center\n";
        out << "Author: Heiko Hirschmueller\n";
        out << "Contact: heiko.hirschmueller@roboception.de\n";
#ifdef INCLUDE_GDAL
        out << "\n";
        out << "This program is based in part on the Geospatial Data Abstraction Library (GDAL).\n";
#endif
#if defined (INCLUDE_GDAL) || defined (INCLUDE_JPEG)
        out << "\n";
        out << "This program is based in part on the work of the Independent JPEG Group.\n";
#endif
#if defined (INCLUDE_PNG)
        out << png_get_copyright(0) << "\n";
#endif
        setInfoText(out.str().c_str());
      }
      else
      {
        setInfoText("");
      }

      break;

    case 's':
      if (adapt != 0)
      {
        setSize(adapt->getWidth(), adapt->getHeight());
      }

      break;

    case 'l':
      if (adapt != 0)
      {
        // rotation around center of image part

        int x=imx;
        int y=imy;
        int w, h;

        getSize(w, h);

        if (adapt->getFlip())
        {
          x=adapt->getWidth()-w-x;
        }

        imx=y+h/2-w/2;
        imy=adapt->getWidth()-1-(x+w/2)-h/2;

        if (adapt->getFlip())
        {
          imx=adapt->getHeight()-w-imx;
        }

        adapt->setRotationFlip(adapt->getRotation()-1, adapt->getFlip());

        redrawImage();
        updateInfo();
      }

      break;

    case 'r':
      if (adapt != 0)
      {
        // rotation around center of image part

        int x=imx;
        int y=imy;
        int w, h;

        getSize(w, h);

        if (adapt->getFlip())
        {
          x=adapt->getWidth()-w-x;
        }

        imx=adapt->getHeight()-1-(y+h/2)-w/2;
        imy=x+w/2-h/2;

        if (adapt->getFlip())
        {
          imx=adapt->getHeight()-w-imx;
        }

        adapt->setRotationFlip(adapt->getRotation()+1, adapt->getFlip());

        redrawImage();
        updateInfo();
      }

      break;

    case 'f':
      if (adapt != 0)
      {
        // flip at center of image part

        int w, h;

        getSize(w, h);

        imx=adapt->getWidth()-w-imx;

        adapt->setRotationFlip(adapt->getRotation(), !adapt->getFlip());

        redrawImage();
        updateInfo();
      }

      break;

    case 'q':
      sendClose();
      break;
  }

  if (key == k_esc)
  {
    sendClose();
  }
}